

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::refine(btSoftBody *this,ImplicitFn *ifn,btScalar accurary,bool cut)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint n;
  btScalar bVar3;
  btScalar bVar4;
  Node *pNVar5;
  Face *pFVar6;
  Node *pNVar7;
  undefined1 auVar8 [16];
  int iVar9;
  btScalar bVar10;
  ulong uVar11;
  btVector3 bVar12;
  Node **ppNVar13;
  int *piVar14;
  long lVar15;
  undefined7 in_register_00000011;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  Link *pLVar21;
  btVector3 *pbVar22;
  int iVar23;
  int iVar24;
  Link *pLVar25;
  Link *pLVar26;
  Link *pLVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  size_t size;
  ulong uVar32;
  long lVar33;
  bool bVar34;
  byte bVar35;
  float fVar36;
  float fVar37;
  btScalar bVar38;
  uint in_XMM0_Db;
  undefined8 uVar39;
  uint in_XMM0_Dc;
  uint extraout_XMM0_Dc;
  uint in_XMM0_Dd;
  uint extraout_XMM0_Dd;
  float fVar41;
  float fVar43;
  uint uVar44;
  uint uVar45;
  undefined1 auVar42 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  btAlignedObjectArray<int> ranks;
  btAlignedObjectArray<int> cnodes;
  btVector3 x;
  btSymMatrix<int> edges;
  btAlignedObjectArray<int> todelete;
  float local_1b4;
  btAlignedObjectArray<int> local_178;
  btAlignedObjectArray<int> local_158;
  float local_138;
  float fStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined4 local_11c;
  undefined1 local_118 [8];
  uint uStack_110;
  uint uStack_10c;
  ulong local_108;
  long local_100;
  float local_f8;
  float fStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  ulong local_e0;
  btVector3 local_d8 [4];
  btScalar local_98;
  btSymMatrix<int> local_90;
  btAlignedObjectArray<int> local_68;
  btScalar local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint uVar40;
  
  bVar35 = 0;
  local_11c = (undefined4)CONCAT71(in_register_00000011,cut);
  pNVar5 = (this->m_nodes).m_data;
  n = (this->m_nodes).m_size;
  uVar32 = (ulong)n;
  local_d8[0].m_floats[0] = -NAN;
  btSymMatrix<int>::btSymMatrix(&local_90,n,(int *)local_d8);
  if (0 < (this->m_links).m_size) {
    iVar18 = 0;
    do {
      pLVar25 = (this->m_links).m_data;
      if ((pLVar25[iVar18].field_0x24 & 1) != 0) {
        fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pLVar25[iVar18].m_n[0]->m_x);
        fVar37 = (float)(**(code **)(*(long *)ifn + 0x10))();
        if (fVar36 * fVar37 <= 0.0) {
          pLVar27 = (this->m_links).m_data;
          pLVar25 = pLVar27 + iVar18;
          pLVar27 = pLVar27 + (long)(this->m_links).m_size + -1;
          pLVar21 = pLVar25;
          pbVar22 = local_d8;
          for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
            *(void **)pbVar22->m_floats = (pLVar21->super_Feature).super_Element.m_tag;
            pLVar21 = (Link *)((long)pLVar21 + (ulong)bVar35 * -0x10 + 8);
            pbVar22 = (btVector3 *)((long)(pbVar22 + -(ulong)bVar35) + 8);
          }
          pLVar21 = pLVar27;
          pLVar26 = pLVar25;
          for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pLVar26->super_Feature).super_Element.m_tag =
                 (pLVar21->super_Feature).super_Element.m_tag;
            pLVar21 = (Link *)((long)pLVar21 + (ulong)bVar35 * -0x10 + 8);
            pLVar26 = (Link *)((long)pLVar26 + (ulong)bVar35 * -0x10 + 8);
          }
          (pLVar25->m_c3).m_floats[3] = (pLVar27->m_c3).m_floats[3];
          pbVar22 = local_d8;
          pLVar25 = pLVar27;
          for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pLVar25->super_Feature).super_Element.m_tag = *(void **)pbVar22->m_floats;
            pbVar22 = (btVector3 *)((long)(pbVar22 + -(ulong)bVar35) + 8);
            pLVar25 = (Link *)((long)pLVar25 + (ulong)bVar35 * -0x10 + 8);
          }
          (pLVar27->m_c3).m_floats[3] = local_98;
          piVar14 = &(this->m_links).m_size;
          *piVar14 = *piVar14 + -1;
          iVar18 = iVar18 + -1;
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < (this->m_links).m_size);
  }
  if (0 < (this->m_links).m_size) {
    ppNVar13 = ((this->m_links).m_data)->m_n + 1;
    lVar16 = 0;
    do {
      iVar20 = (int)((ulong)((long)ppNVar13[-1] - (long)pNVar5) >> 3) * -0x11111111;
      iVar18 = (int)((ulong)((long)*ppNVar13 - (long)pNVar5) >> 3);
      iVar23 = iVar18 * -0x11111111;
      bVar34 = iVar20 + iVar18 * 0x11111111 < 0;
      iVar18 = iVar23;
      if (SBORROW4(iVar20,iVar23) != bVar34) {
        iVar18 = iVar20;
      }
      if (iVar20 != iVar23 && SBORROW4(iVar20,iVar23) == bVar34) {
        iVar23 = iVar20;
      }
      local_90.store.m_data[((iVar23 + 1) * iVar23) / 2 + iVar18] = -1;
      lVar16 = lVar16 + 1;
      ppNVar13 = ppNVar13 + 9;
    } while (lVar16 < (this->m_links).m_size);
  }
  if (0 < (this->m_faces).m_size) {
    ppNVar13 = ((this->m_faces).m_data)->m_n + 2;
    lVar16 = 0;
    do {
      iVar24 = (int)((ulong)((long)ppNVar13[-2] - (long)pNVar5) >> 3);
      iVar20 = iVar24 * -0x11111111;
      iVar18 = (int)((ulong)((long)ppNVar13[-1] - (long)pNVar5) >> 3);
      iVar23 = iVar18 * -0x11111111;
      bVar34 = iVar20 + iVar18 * 0x11111111 < 0;
      iVar18 = iVar23;
      if (SBORROW4(iVar20,iVar23) != bVar34) {
        iVar18 = iVar20;
      }
      iVar28 = iVar23;
      if (iVar20 != iVar23 && SBORROW4(iVar20,iVar23) == bVar34) {
        iVar28 = iVar20;
      }
      local_90.store.m_data[((iVar28 + 1) * iVar28) / 2 + iVar18] = -1;
      iVar18 = (int)((ulong)((long)*ppNVar13 - (long)pNVar5) >> 3);
      iVar28 = iVar18 * -0x11111111;
      bVar34 = iVar23 + iVar18 * 0x11111111 < 0;
      iVar18 = iVar28;
      if (SBORROW4(iVar23,iVar28) != bVar34) {
        iVar18 = iVar23;
      }
      if (iVar23 == iVar28 || SBORROW4(iVar23,iVar28) != bVar34) {
        iVar23 = iVar28;
      }
      iVar24 = iVar28 + iVar24 * 0x11111111;
      iVar9 = iVar20;
      if (iVar28 < iVar20) {
        iVar9 = iVar28;
      }
      local_90.store.m_data[((iVar23 + 1) * iVar23) / 2 + iVar18] = -1;
      if (iVar24 != 0 && SBORROW4(iVar28,iVar20) == iVar24 < 0) {
        iVar20 = iVar28;
      }
      local_90.store.m_data[((iVar20 + 1) * iVar20) / 2 + iVar9] = -1;
      lVar16 = lVar16 + 1;
      ppNVar13 = ppNVar13 + 9;
    } while (lVar16 < (this->m_faces).m_size);
  }
  if (0 < (int)n) {
    local_48 = -accurary;
    uStack_44 = in_XMM0_Db ^ 0x80000000;
    uStack_40 = in_XMM0_Dc ^ 0x80000000;
    uStack_3c = in_XMM0_Dd ^ 0x80000000;
    local_108 = 1;
    uVar19 = 0;
    do {
      local_e0 = uVar19 + 1;
      if (local_e0 < uVar32) {
        local_100 = uVar19 * 0x78;
        uVar30 = local_108;
        do {
          iVar23 = (int)uVar19;
          iVar20 = (int)uVar30;
          iVar18 = iVar20;
          if (iVar23 < iVar20) {
            iVar18 = iVar23;
          }
          uVar11 = uVar30;
          if (iVar20 < iVar23) {
            uVar11 = uVar19;
          }
          uVar17 = ((uint)(((int)uVar11 + 1) * (int)uVar11) >> 1) + iVar18;
          if (local_90.store.m_data[uVar17] == -1) {
            pNVar5 = (this->m_nodes).m_data;
            fVar37 = (float)(**(code **)(*(long *)ifn + 0x10))
                                      (ifn,(long)(pNVar5->m_x).m_floats + local_100);
            fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))();
            lVar16 = local_100;
            local_1b4 = 0.0;
            if (fVar37 <= fVar36) {
              _local_118 = ZEXT816(0x3f800000);
              fVar41 = fVar37;
            }
            else {
              _local_118 = ZEXT816(0);
              local_1b4 = 1.0;
              fVar41 = fVar36;
              fVar36 = fVar37;
            }
            fVar37 = -1.0;
            fVar46 = 0.0;
            uVar44 = 0;
            uVar45 = 0;
            if (accurary <= fVar36) {
              fVar37 = -1.0;
              fVar46 = 0.0;
              uVar44 = 0;
              uVar45 = 0;
              if (fVar41 <= local_48) {
                iVar18 = 0x100;
                do {
                  local_f8 = ((float)local_118._0_4_ - local_1b4) * (fVar41 / (fVar41 - fVar36)) +
                             local_1b4;
                  fVar37 = *(float *)((long)(pNVar5->m_x).m_floats + lVar16 + 8);
                  uVar39 = *(undefined8 *)pNVar5[uVar30].m_x.m_floats;
                  uVar2 = *(undefined8 *)((long)(pNVar5->m_x).m_floats + lVar16);
                  fVar46 = (float)uVar2;
                  fVar43 = (float)((ulong)uVar2 >> 0x20);
                  fStack_f4 = (float)local_118._4_4_;
                  uStack_f0 = uStack_110;
                  uStack_ec = uStack_10c;
                  local_d8[0].m_floats[1] =
                       local_f8 * ((float)((ulong)uVar39 >> 0x20) - fVar43) + fVar43;
                  local_d8[0].m_floats[0] = local_f8 * ((float)uVar39 - fVar46) + fVar46;
                  local_d8[0].m_floats[2] =
                       (pNVar5[uVar30].m_x.m_floats[2] - fVar37) * local_f8 + fVar37;
                  local_d8[0].m_floats[3] = 0.0;
                  uVar39 = (**(code **)(*(long *)ifn + 0x10))();
                  uVar40 = (uint)((ulong)uVar39 >> 0x20);
                  fVar43 = (float)uVar39;
                  bVar34 = false;
                  iVar23 = 2;
                  fVar37 = local_138;
                  fVar46 = fStack_134;
                  uVar44 = uStack_130;
                  uVar45 = uStack_12c;
                  if (0.0 < local_f8) {
                    iVar23 = 2;
                    if (local_f8 < 1.0) {
                      if (accurary <= ABS(fVar43)) {
                        fVar47 = fVar43;
                        if (fVar43 < 0.0) {
                          local_1b4 = local_f8;
                          fVar41 = fVar43;
                          fVar47 = fVar36;
                        }
                        auVar48._0_4_ = local_118._0_4_ & -(uint)(fVar43 < 0.0);
                        auVar48._4_4_ = local_118._4_4_ & uVar40;
                        auVar48._8_4_ = uStack_110 & extraout_XMM0_Dc;
                        auVar48._12_4_ = uStack_10c & extraout_XMM0_Dd;
                        auVar42._4_4_ = ~uVar40 & (uint)fStack_f4;
                        auVar42._0_4_ = ~-(uint)(fVar43 < 0.0) & (uint)local_f8;
                        auVar42._8_4_ = ~extraout_XMM0_Dc & uStack_f0;
                        auVar42._12_4_ = ~extraout_XMM0_Dd & uStack_ec;
                        _local_118 = auVar48 | auVar42;
                        iVar23 = 0;
                        bVar34 = true;
                        fVar36 = fVar47;
                        goto LAB_001e1214;
                      }
                      iVar23 = 1;
                      fVar37 = local_f8;
                      fVar46 = fStack_f4;
                      uVar44 = uStack_f0;
                      uVar45 = uStack_ec;
                    }
                    bVar34 = false;
                  }
LAB_001e1214:
                  if (!bVar34) goto LAB_001e1236;
                  iVar18 = iVar18 + -1;
                  local_138 = fVar37;
                  fStack_134 = fVar46;
                  uStack_130 = uVar44;
                  uStack_12c = uVar45;
                } while (iVar18 != 0);
                iVar23 = 2;
LAB_001e1236:
                if (iVar23 == 2) {
                  fVar37 = -1.0;
                  fVar46 = 0.0;
                  uVar44 = 0;
                  uVar45 = 0;
                }
              }
            }
            if (0.0 < fVar37) {
              fVar36 = *(float *)((long)(pNVar5->m_x).m_floats + lVar16 + 8);
              uVar39 = *(undefined8 *)pNVar5[uVar30].m_x.m_floats;
              uVar2 = *(undefined8 *)((long)(pNVar5->m_x).m_floats + lVar16);
              fVar41 = (float)uVar2;
              fVar43 = (float)((ulong)uVar2 >> 0x20);
              local_d8[0].m_floats[0] = ((float)uVar39 - fVar41) * fVar37 + fVar41;
              local_d8[0].m_floats[1] = ((float)((ulong)uVar39 >> 0x20) - fVar43) * fVar37 + fVar43;
              local_d8[0].m_floats[2] = (pNVar5[uVar30].m_x.m_floats[2] - fVar36) * fVar37 + fVar36;
              local_d8[0].m_floats[3] = 0.0;
              fVar36 = *(float *)((long)(&pNVar5->m_n + 1) + lVar16);
              fVar41 = pNVar5[uVar30].m_im;
              if (fVar36 <= 0.0) {
                bVar38 = 0.0;
                if (0.0 < fVar41) {
                  pNVar5[uVar30].m_im = fVar41 + fVar41;
                  bVar38 = 1.0 / (fVar41 + fVar41);
                }
              }
              else if (fVar41 <= 0.0) {
                *(float *)((long)(&pNVar5->m_n + 1) + lVar16) = fVar36 + fVar36;
                bVar38 = 1.0 / (fVar36 + fVar36);
              }
              else {
                auVar8._4_4_ = fVar36;
                auVar8._0_4_ = fVar41;
                auVar8._8_8_ = 0;
                auVar42 = divps(_DAT_001f53f0,auVar8);
                fVar41 = auVar42._0_4_;
                fVar43 = auVar42._4_4_;
                fVar47 = (fVar41 - fVar43) * fVar37 + fVar43;
                fVar36 = (fVar43 + fVar41) / (fVar43 + fVar41 + fVar47);
                *(float *)((long)(&pNVar5->m_n + 1) + lVar16) = 1.0 / (fVar43 * fVar36);
                pNVar5[uVar30].m_im = 1.0 / (fVar41 * fVar36);
                bVar38 = fVar36 * fVar47;
              }
              fVar36 = pNVar5[uVar30].m_v.m_floats[2];
              fVar41 = *(float *)((long)(pNVar5->m_v).m_floats + lVar16 + 8);
              _uStack_110 = 0;
              local_118 = (undefined1  [8])*(ulong *)pNVar5[uVar30].m_v.m_floats;
              uVar39 = *(undefined8 *)((long)(pNVar5->m_v).m_floats + lVar16);
              local_f8 = (float)uVar39;
              fStack_f4 = (float)((ulong)uVar39 >> 0x20);
              uStack_f0 = 0;
              uStack_ec = 0;
              local_138 = fVar37;
              fStack_134 = fVar46;
              uStack_130 = uVar44;
              uStack_12c = uVar45;
              appendNode(this,local_d8,bVar38);
              iVar18 = (this->m_nodes).m_size;
              local_90.store.m_data[uVar17] = iVar18 + -1;
              pbVar22 = &(this->m_nodes).m_data[(long)iVar18 + -1].m_v;
              pbVar22->m_floats[0] = fVar37 * ((float)local_118._0_4_ - local_f8) + local_f8;
              pbVar22->m_floats[1] = fVar37 * ((float)local_118._4_4_ - fStack_f4) + fStack_f4;
              pbVar22->m_floats[2] = local_138 * (fVar36 - fVar41) + fVar41;
              pbVar22->m_floats[3] = 0.0;
            }
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar32);
      }
      local_108 = local_108 + 1;
      uVar19 = local_e0;
    } while (local_e0 != uVar32);
  }
  pNVar5 = (this->m_nodes).m_data;
  lVar16 = (long)(this->m_links).m_size;
  if (0 < lVar16) {
    lVar33 = 0x18;
    lVar29 = 0;
    do {
      pLVar25 = (this->m_links).m_data;
      iVar18 = (int)(*(long *)((long)pLVar25->m_n + lVar33 + -0x18) - (long)pNVar5 >> 3) *
               -0x11111111;
      if ((iVar18 < (int)n) &&
         (iVar23 = (int)(*(long *)((long)pLVar25->m_n + lVar33 + -0x10) - (long)pNVar5 >> 3) *
                   -0x11111111, iVar23 < (int)n)) {
        iVar20 = iVar23;
        if (iVar18 < iVar23) {
          iVar20 = iVar18;
        }
        iVar24 = iVar23;
        if (iVar23 < iVar18) {
          iVar24 = iVar18;
        }
        lVar31 = (long)local_90.store.m_data[((iVar24 + 1) * iVar24) / 2 + iVar20];
        if (0 < lVar31) {
          appendLink(this,(int)lVar29,(Material *)0x0);
          pLVar25 = (this->m_links).m_data;
          lVar15 = (long)(this->m_links).m_size;
          *(Node **)((long)pLVar25->m_n + lVar33 + -0x18) = (this->m_nodes).m_data + iVar18;
          *(Node **)((long)pLVar25->m_n + lVar33 + -0x10) = (this->m_nodes).m_data + lVar31;
          pLVar25[lVar15 + -1].m_n[0] = (this->m_nodes).m_data + lVar31;
          pLVar25[lVar15 + -1].m_n[1] = (this->m_nodes).m_data + iVar23;
        }
      }
      lVar29 = lVar29 + 1;
      lVar33 = lVar33 + 0x48;
    } while (lVar16 != lVar29);
  }
  if (0 < (this->m_faces).m_size) {
    iVar18 = 0;
    do {
      bVar12.m_floats = local_d8[0].m_floats;
      pFVar6 = (this->m_faces).m_data;
      local_d8[0].m_floats[1] =
           (btScalar)((int)((ulong)((long)pFVar6[iVar18].m_n[1] - (long)pNVar5) >> 3) * -0x11111111)
      ;
      local_d8[0].m_floats[0] =
           (btScalar)((int)((ulong)((long)pFVar6[iVar18].m_n[0] - (long)pNVar5) >> 3) * -0x11111111)
      ;
      local_d8[0].m_floats[3] = bVar12.m_floats[3];
      local_d8[0].m_floats[2] =
           (btScalar)((int)((ulong)((long)pFVar6[iVar18].m_n[2] - (long)pNVar5) >> 3) * -0x11111111)
      ;
      uVar32 = 0;
      uVar19 = 2;
      do {
        uVar30 = uVar32;
        bVar38 = local_d8[0].m_floats[uVar19 & 0xffffffff];
        if ((int)bVar38 < (int)n) {
          bVar3 = local_d8[0].m_floats[uVar30];
          if ((int)bVar3 < (int)n) {
            bVar4 = bVar3;
            if ((int)bVar38 < (int)bVar3) {
              bVar4 = bVar38;
            }
            bVar10 = bVar3;
            if ((int)bVar3 < (int)bVar38) {
              bVar10 = bVar38;
            }
            iVar23 = local_90.store.m_data[(((int)bVar10 + 1) * (int)bVar10) / 2 + (int)bVar4];
            lVar16 = (long)iVar23;
            if (0 < lVar16) {
              appendFace(this,iVar18,(Material *)0x0);
              pFVar6 = (this->m_faces).m_data;
              lVar33 = (long)(this->m_faces).m_size;
              lVar29 = 0;
              if (uVar30 != 2) {
                lVar29 = uVar30 + 1;
              }
              bVar4 = local_d8[0].m_floats[lVar29];
              pFVar6[iVar18].m_n[0] = (this->m_nodes).m_data + (int)bVar4;
              pFVar6[iVar18].m_n[1] = (this->m_nodes).m_data + (int)bVar38;
              pFVar6[iVar18].m_n[2] = (this->m_nodes).m_data + lVar16;
              pFVar6[lVar33 + -1].m_n[0] = (this->m_nodes).m_data + lVar16;
              pFVar6[lVar33 + -1].m_n[1] = (this->m_nodes).m_data + (int)bVar3;
              pFVar6[lVar33 + -1].m_n[2] = (this->m_nodes).m_data + (int)bVar4;
              pNVar7 = (this->m_nodes).m_data;
              appendLink(this,pNVar7 + lVar16,pNVar7 + (int)bVar4,
                         pFVar6[iVar18].super_Feature.m_material,false);
              iVar18 = iVar18 + -1;
            }
            if (0 < iVar23) break;
          }
        }
        uVar32 = uVar30 + 1;
        uVar19 = uVar30;
      } while (uVar30 + 1 != 3);
      iVar18 = iVar18 + 1;
    } while (iVar18 < (this->m_faces).m_size);
  }
  if ((char)local_11c != '\0') {
    local_158.m_ownsMemory = true;
    local_158.m_data = (int *)0x0;
    local_158.m_size = 0;
    local_158.m_capacity = 0;
    iVar18 = (this->m_nodes).m_size;
    lVar16 = (long)iVar18;
    if ((-1 < lVar16) && (iVar18 != 0)) {
      piVar14 = (int *)btAlignedAllocInternal(lVar16 * 4,0x10);
      if (0 < (long)local_158.m_size) {
        lVar29 = 0;
        do {
          piVar14[lVar29] = local_158.m_data[lVar29];
          lVar29 = lVar29 + 1;
        } while (local_158.m_size != lVar29);
      }
      if ((local_158.m_data != (int *)0x0) && (local_158.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_158.m_data);
      }
      local_158.m_ownsMemory = true;
      local_158.m_data = piVar14;
      local_158.m_capacity = iVar18;
      if (iVar18 != 0) {
        memset(piVar14,0,lVar16 * 4);
      }
    }
    local_158.m_size = iVar18;
    if (0 < iVar18) {
      lVar29 = 0xc;
      lVar33 = 0;
      do {
        local_d8[0].m_floats =
             *(btScalar (*) [4])((long)(&((this->m_nodes).m_data)->m_x + -3) + lVar29 * 4);
        if (((int)n <= lVar33) ||
           (fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(), ABS(fVar36) < accurary)) {
          pNVar5 = (this->m_nodes).m_data;
          puVar1 = (undefined8 *)
                   ((long)&(((Node *)(&pNVar5->m_x + -1))->super_Feature).super_Element.m_tag +
                   lVar29 * 4);
          uVar39 = *puVar1;
          uVar2 = puVar1[1];
          local_178._0_4_ = SUB84(uVar39,0);
          local_178.m_size = (int)((ulong)uVar39 >> 0x20);
          local_178.m_capacity = (int)uVar2;
          local_178._12_4_ = SUB84((ulong)uVar2 >> 0x20,0);
          fVar36 = (pNVar5->m_v).m_floats[lVar29];
          bVar38 = (btScalar)(-(uint)(0.0 < fVar36) & (uint)(1.0 / fVar36));
          if (0.0 < bVar38) {
            bVar38 = bVar38 * 0.5;
            fVar36 = (pNVar5->m_v).m_floats[lVar29];
            (pNVar5->m_v).m_floats[lVar29] = fVar36 + fVar36;
          }
          appendNode(this,local_d8,bVar38);
          iVar18 = (this->m_nodes).m_size;
          local_158.m_data[lVar33] = iVar18 + -1;
          pbVar22 = &(this->m_nodes).m_data[(long)iVar18 + -1].m_v;
          *(ulong *)pbVar22->m_floats = CONCAT44(local_178.m_size,local_178._0_4_);
          *(ulong *)(pbVar22->m_floats + 2) = CONCAT44(local_178._12_4_,local_178.m_capacity);
        }
        lVar33 = lVar33 + 1;
        lVar29 = lVar29 + 0x1e;
      } while (lVar16 != lVar33);
    }
    pNVar5 = (this->m_nodes).m_data;
    lVar16 = (long)(this->m_links).m_size;
    if (0 < lVar16) {
      lVar29 = 0;
      do {
        pLVar25 = (this->m_links).m_data;
        if ((local_158.m_data
             [(int)((ulong)((long)pLVar25[lVar29].m_n[0] - (long)pNVar5) >> 3) * -0x11111111] == 0)
           || (local_158.m_data
               [(int)((long)pLVar25[lVar29].m_n[1] - (long)pNVar5 >> 3) * -0x11111111] == 0)) {
          fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))();
          iVar18 = 0;
          if ((fVar36 < accurary) &&
             (fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar36 < accurary)) {
            iVar18 = (int)lVar29;
          }
        }
        else {
          appendLink(this,(int)lVar29,(Material *)0x0);
          iVar18 = (this->m_links).m_size + -1;
        }
        if (iVar18 != 0) {
          pLVar25 = (this->m_links).m_data;
          lVar33 = 0;
          do {
            if ((long)local_158.m_data
                      [(int)((ulong)((long)pLVar25[iVar18].m_n[lVar33] - (long)pNVar5) >> 3) *
                       -0x11111111] != 0) {
              pLVar25[iVar18].m_n[lVar33] =
                   (this->m_nodes).m_data +
                   local_158.m_data
                   [(int)((ulong)((long)pLVar25[iVar18].m_n[lVar33] - (long)pNVar5) >> 3) *
                    -0x11111111];
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 == 1);
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != lVar16);
    }
    lVar16 = (long)(this->m_faces).m_size;
    if (0 < lVar16) {
      lVar29 = 0x10;
      lVar33 = 0;
      do {
        pFVar6 = (this->m_faces).m_data;
        fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))();
        if (((fVar36 < accurary) &&
            (fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar36 < accurary)) &&
           (fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar36 < accurary)) {
          lVar31 = 0;
          do {
            if ((long)local_158.m_data
                      [(int)((ulong)(*(long *)((long)pFVar6->m_n + lVar31 * 8 + lVar29 + -0x10) -
                                    (long)pNVar5) >> 3) * -0x11111111] != 0) {
              *(Node **)((long)pFVar6->m_n + lVar31 * 8 + lVar29 + -0x10) =
                   (this->m_nodes).m_data +
                   local_158.m_data
                   [(int)((ulong)(*(long *)((long)pFVar6->m_n + lVar31 * 8 + lVar29 + -0x10) -
                                 (long)pNVar5) >> 3) * -0x11111111];
            }
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
        }
        lVar33 = lVar33 + 1;
        lVar29 = lVar29 + 0x48;
      } while (lVar33 != lVar16);
    }
    iVar18 = (this->m_nodes).m_size;
    local_178.m_ownsMemory = true;
    local_178.m_data = (int *)0x0;
    local_178.m_size = 0;
    local_178.m_capacity = 0;
    local_68.m_ownsMemory = true;
    local_68.m_data = (int *)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
    if ((-1 < (long)iVar18) && (iVar18 != 0)) {
      size = (long)iVar18 << 2;
      piVar14 = (int *)btAlignedAllocInternal(size,0x10);
      if (0 < (long)local_178.m_size) {
        lVar16 = 0;
        do {
          piVar14[lVar16] = local_178.m_data[lVar16];
          lVar16 = lVar16 + 1;
        } while (local_178.m_size != lVar16);
      }
      if ((local_178.m_data != (int *)0x0) && (local_178.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_178.m_data);
      }
      local_178.m_ownsMemory = true;
      local_178.m_capacity = iVar18;
      local_178.m_data = piVar14;
      if (iVar18 != 0) {
        memset(piVar14,0,size);
      }
    }
    lVar16 = (long)(this->m_links).m_size;
    if (0 < lVar16) {
      ppNVar13 = ((this->m_links).m_data)->m_n;
      lVar29 = 0;
      do {
        lVar33 = 0;
        do {
          local_178.m_data[(int)((ulong)((long)ppNVar13[lVar33] - (long)pNVar5) >> 3) * -0x11111111]
               = local_178.m_data
                 [(int)((ulong)((long)ppNVar13[lVar33] - (long)pNVar5) >> 3) * -0x11111111] + 1;
          lVar33 = lVar33 + 1;
        } while (lVar33 == 1);
        lVar29 = lVar29 + 1;
        ppNVar13 = ppNVar13 + 9;
      } while (lVar29 != lVar16);
    }
    lVar16 = (long)(this->m_faces).m_size;
    if (0 < lVar16) {
      ppNVar13 = ((this->m_faces).m_data)->m_n;
      lVar29 = 0;
      do {
        lVar33 = 0;
        do {
          local_178.m_data[(int)((ulong)((long)ppNVar13[lVar33] - (long)pNVar5) >> 3) * -0x11111111]
               = local_178.m_data
                 [(int)((ulong)((long)ppNVar13[lVar33] - (long)pNVar5) >> 3) * -0x11111111] + 1;
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        lVar29 = lVar29 + 1;
        ppNVar13 = ppNVar13 + 9;
      } while (lVar29 != lVar16);
    }
    if (0 < (this->m_links).m_size) {
      iVar23 = 0;
      do {
        pLVar25 = (this->m_links).m_data;
        iVar20 = (int)((ulong)((long)pLVar25[iVar23].m_n[0] - (long)pNVar5) >> 3) * -0x11111111;
        iVar24 = (int)((ulong)((long)pLVar25[iVar23].m_n[1] - (long)pNVar5) >> 3) * -0x11111111;
        if ((local_178.m_data[iVar20] == 1) || (local_178.m_data[iVar24] == 1)) {
          local_178.m_data[iVar20] = local_178.m_data[iVar20] + -1;
          local_178.m_data[iVar24] = local_178.m_data[iVar24] + -1;
          pLVar27 = pLVar25 + iVar23;
          iVar20 = (this->m_links).m_size;
          pLVar21 = pLVar27;
          pbVar22 = local_d8;
          for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
            *(void **)pbVar22->m_floats = (pLVar21->super_Feature).super_Element.m_tag;
            pLVar21 = (Link *)((long)pLVar21 + (ulong)bVar35 * -0x10 + 8);
            pbVar22 = (btVector3 *)((long)(pbVar22 + -(ulong)bVar35) + 8);
          }
          pLVar21 = pLVar25 + (long)iVar20 + -1;
          pLVar26 = pLVar27;
          for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pLVar26->super_Feature).super_Element.m_tag =
                 (pLVar21->super_Feature).super_Element.m_tag;
            pLVar21 = (Link *)((long)pLVar21 + (ulong)bVar35 * -0x10 + 8);
            pLVar26 = (Link *)((long)pLVar26 + (ulong)bVar35 * -0x10 + 8);
          }
          (pLVar27->m_c3).m_floats[3] = pLVar25[(long)iVar20 + -1].m_c3.m_floats[3];
          pbVar22 = local_d8;
          pLVar27 = pLVar25 + (long)iVar20 + -1;
          for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pLVar27->super_Feature).super_Element.m_tag = *(void **)pbVar22->m_floats;
            pbVar22 = (btVector3 *)((long)(pbVar22 + -(ulong)bVar35) + 8);
            pLVar27 = (Link *)((long)pLVar27 + (ulong)bVar35 * -0x10 + 8);
          }
          pLVar25[(long)iVar20 + -1].m_c3.m_floats[3] = local_98;
          piVar14 = &(this->m_links).m_size;
          *piVar14 = *piVar14 + -1;
          iVar23 = iVar23 + -1;
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < (this->m_links).m_size);
    }
    local_178.m_size = iVar18;
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_68);
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_178);
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_158);
  }
  this->m_bUpdateRtCst = true;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_90.store);
  return;
}

Assistant:

void			btSoftBody::refine(ImplicitFn* ifn,btScalar accurary,bool cut)
{
	const Node*			nbase = &m_nodes[0];
	int					ncount = m_nodes.size();
	btSymMatrix<int>	edges(ncount,-2);
	int					newnodes=0;
	int i,j,k,ni;

	/* Filter out		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		if(l.m_bbending)
		{
			if(!SameSign(ifn->Eval(l.m_n[0]->m_x),ifn->Eval(l.m_n[1]->m_x)))
			{
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}	
	}
	/* Fill edges		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		edges(int(l.m_n[0]-nbase),int(l.m_n[1]-nbase))=-1;
	}
	for(i=0;i<m_faces.size();++i)
	{	
		Face&	f=m_faces[i];
		edges(int(f.m_n[0]-nbase),int(f.m_n[1]-nbase))=-1;
		edges(int(f.m_n[1]-nbase),int(f.m_n[2]-nbase))=-1;
		edges(int(f.m_n[2]-nbase),int(f.m_n[0]-nbase))=-1;
	}
	/* Intersect		*/ 
	for(i=0;i<ncount;++i)
	{
		for(j=i+1;j<ncount;++j)
		{
			if(edges(i,j)==-1)
			{
				Node&			a=m_nodes[i];
				Node&			b=m_nodes[j];
				const btScalar	t=ImplicitSolve(ifn,a.m_x,b.m_x,accurary);
				if(t>0)
				{
					const btVector3	x=Lerp(a.m_x,b.m_x,t);
					const btVector3	v=Lerp(a.m_v,b.m_v,t);
					btScalar		m=0;
					if(a.m_im>0)
					{
						if(b.m_im>0)
						{
							const btScalar	ma=1/a.m_im;
							const btScalar	mb=1/b.m_im;
							const btScalar	mc=Lerp(ma,mb,t);
							const btScalar	f=(ma+mb)/(ma+mb+mc);
							a.m_im=1/(ma*f);
							b.m_im=1/(mb*f);
							m=mc*f;
						}
						else
						{ a.m_im/=0.5f;m=1/a.m_im; }
					}
					else
					{
						if(b.m_im>0)
						{ b.m_im/=0.5f;m=1/b.m_im; }
						else
							m=0;
					}
					appendNode(x,m);
					edges(i,j)=m_nodes.size()-1;
					m_nodes[edges(i,j)].m_v=v;
					++newnodes;
				}
			}
		}
	}
	nbase=&m_nodes[0];
	/* Refine links		*/ 
	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&		feat=m_links[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase)};
		if((idx[0]<ncount)&&(idx[1]<ncount))
		{
			const int ni=edges(idx[0],idx[1]);
			if(ni>0)
			{
				appendLink(i);
				Link*		pft[]={	&m_links[i],
					&m_links[m_links.size()-1]};			
				pft[0]->m_n[0]=&m_nodes[idx[0]];
				pft[0]->m_n[1]=&m_nodes[ni];
				pft[1]->m_n[0]=&m_nodes[ni];
				pft[1]->m_n[1]=&m_nodes[idx[1]];
			}
		}
	}
	/* Refine faces		*/ 
	for(i=0;i<m_faces.size();++i)
	{
		const Face&	feat=m_faces[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase),
			int(feat.m_n[2]-nbase)};
		for(j=2,k=0;k<3;j=k++)
		{
			if((idx[j]<ncount)&&(idx[k]<ncount))
			{
				const int ni=edges(idx[j],idx[k]);
				if(ni>0)
				{
					appendFace(i);
					const int	l=(k+1)%3;
					Face*		pft[]={	&m_faces[i],
						&m_faces[m_faces.size()-1]};
					pft[0]->m_n[0]=&m_nodes[idx[l]];
					pft[0]->m_n[1]=&m_nodes[idx[j]];
					pft[0]->m_n[2]=&m_nodes[ni];
					pft[1]->m_n[0]=&m_nodes[ni];
					pft[1]->m_n[1]=&m_nodes[idx[k]];
					pft[1]->m_n[2]=&m_nodes[idx[l]];
					appendLink(ni,idx[l],pft[0]->m_material);
					--i;break;
				}
			}
		}
	}
	/* Cut				*/ 
	if(cut)
	{	
		btAlignedObjectArray<int>	cnodes;
		const int					pcount=ncount;
		int							i;
		ncount=m_nodes.size();
		cnodes.resize(ncount,0);
		/* Nodes		*/ 
		for(i=0;i<ncount;++i)
		{
			const btVector3	x=m_nodes[i].m_x;
			if((i>=pcount)||(btFabs(ifn->Eval(x))<accurary))
			{
				const btVector3	v=m_nodes[i].m_v;
				btScalar		m=getMass(i);
				if(m>0) { m*=0.5f;m_nodes[i].m_im/=0.5f; }
				appendNode(x,m);
				cnodes[i]=m_nodes.size()-1;
				m_nodes[cnodes[i]].m_v=v;
			}
		}
		nbase=&m_nodes[0];
		/* Links		*/ 
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			const int		id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			int				todetach=0;
			if(cnodes[id[0]]&&cnodes[id[1]])
			{
				appendLink(i);
				todetach=m_links.size()-1;
			}
			else
			{
				if((	(ifn->Eval(m_nodes[id[0]].m_x)<accurary)&&
					(ifn->Eval(m_nodes[id[1]].m_x)<accurary)))
					todetach=i;
			}
			if(todetach)
			{
				Link&	l=m_links[todetach];
				for(int j=0;j<2;++j)
				{
					int cn=cnodes[int(l.m_n[j]-nbase)];
					if(cn) l.m_n[j]=&m_nodes[cn];
				}			
			}
		}
		/* Faces		*/ 
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			Node**			n=	m_faces[i].m_n;
			if(	(ifn->Eval(n[0]->m_x)<accurary)&&
				(ifn->Eval(n[1]->m_x)<accurary)&&
				(ifn->Eval(n[2]->m_x)<accurary))
			{
				for(int j=0;j<3;++j)
				{
					int cn=cnodes[int(n[j]-nbase)];
					if(cn) n[j]=&m_nodes[cn];
				}
			}
		}
		/* Clean orphans	*/ 
		int							nnodes=m_nodes.size();
		btAlignedObjectArray<int>	ranks;
		btAlignedObjectArray<int>	todelete;
		ranks.resize(nnodes,0);
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			for(int j=0;j<2;++j) ranks[int(m_links[i].m_n[j]-nbase)]++;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			for(int j=0;j<3;++j) ranks[int(m_faces[i].m_n[j]-nbase)]++;
		}
		for(i=0;i<m_links.size();++i)
		{
			const int	id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			const bool	sg[]={	ranks[id[0]]==1,
				ranks[id[1]]==1};
			if(sg[0]||sg[1])
			{
				--ranks[id[0]];
				--ranks[id[1]];
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}
#if 0	
		for(i=nnodes-1;i>=0;--i)
		{
			if(!ranks[i]) todelete.push_back(i);
		}	
		if(todelete.size())
		{		
			btAlignedObjectArray<int>&	map=ranks;
			for(int i=0;i<nnodes;++i) map[i]=i;
			PointersToIndices(this);
			for(int i=0,ni=todelete.size();i<ni;++i)
			{
				int		j=todelete[i];
				int&	a=map[j];
				int&	b=map[--nnodes];
				m_ndbvt.remove(m_nodes[a].m_leaf);m_nodes[a].m_leaf=0;
				btSwap(m_nodes[a],m_nodes[b]);
				j=a;a=b;b=j;			
			}
			IndicesToPointers(this,&map[0]);
			m_nodes.resize(nnodes);
		}
#endif
	}
	m_bUpdateRtCst=true;
}